

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_tests.cpp
# Opt level: O0

void __thiscall Inject::simple_inject::test_method(simple_inject *this)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  lazy_ostream *prev;
  service *psVar4;
  undefined4 extraout_var;
  unique_id local_120;
  undefined8 local_118;
  basic_cstring<const_char> local_110;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_100;
  basic_cstring<const_char> local_d8;
  basic_cstring<const_char> local_c8;
  undefined1 local_b8 [8];
  injected<Inject::service> actual;
  context<0> c;
  provides<Inject::service> xxx;
  component<Inject::impl1> local_20;
  component<Inject::impl1> xx;
  component<Inject::service> x;
  simple_inject *this_local;
  
  inject::context<0>::component<Inject::service>::component((component<Inject::service> *)&xx);
  inject::context<0>::component<Inject::impl1>::component(&local_20);
  inject::context<0>::component<Inject::impl1>::provides<Inject::service>::provides
            ((provides<Inject::service> *)&c._parent);
  inject::context<0>::context((context<0> *)&actual._ptr.pn);
  inject::context<0>::bind<Inject::service,Inject::impl1>((context<0> *)&actual._ptr.pn);
  inject::context<0>::injected<Inject::service>::injected((injected<Inject::service> *)local_b8);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
               ,0x65);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_d8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_c8,0x43,&local_d8);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_100,prev,(char (*) [1])0x19674c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_110,
               "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
               ,0x65);
    psVar4 = inject::context<0>::injected<Inject::service>::operator->
                       ((injected<Inject::service> *)local_b8);
    iVar3 = (**psVar4->_vptr_service)();
    local_118 = CONCAT44(extraout_var,iVar3);
    local_120 = inject::id_of<Inject::impl1>::id();
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (&local_100,&local_110,0x43,1,2,&local_118,"actual->id()",&local_120,
               "id_of<impl1>::id()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_100);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  inject::context<0>::injected<Inject::service>::~injected((injected<Inject::service> *)local_b8);
  inject::context<0>::~context((context<0> *)&actual._ptr.pn);
  inject::context<0>::component<Inject::impl1>::provides<Inject::service>::~provides
            ((provides<Inject::service> *)&c._parent);
  inject::context<0>::component<Inject::impl1>::~component(&local_20);
  inject::context<0>::component<Inject::service>::~component((component<Inject::service> *)&xx);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(simple_inject)
{
    context<>::component<service> x;
    context<>::component<impl1> xx;
    context<>::component<impl1>::provides<service> xxx;

    context<> c;
    c.bind<service, impl1>();

    context<>::injected<service> actual;
    BOOST_CHECK_EQUAL(actual->id(), id_of<impl1>::id());
}